

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AppendProperty(cmMakefile *this,string *prop,char *value,bool asString)

{
  cmStateDirectory local_60;
  undefined1 local_38 [8];
  cmListFileBacktrace lfbt;
  bool asString_local;
  char *value_local;
  string *prop_local;
  cmMakefile *this_local;
  
  lfbt.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = asString;
  GetBacktrace((cmMakefile *)local_38);
  cmStateSnapshot::GetDirectory(&local_60,&this->StateSnapshot);
  cmStateDirectory::AppendProperty
            (&local_60,prop,value,
             (bool)(lfbt.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi._7_1_ & 1),(cmListFileBacktrace *)local_38);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_38);
  return;
}

Assistant:

void cmMakefile::AppendProperty(const std::string& prop, const char* value,
                                bool asString)
{
  cmListFileBacktrace lfbt = this->GetBacktrace();
  this->StateSnapshot.GetDirectory().AppendProperty(prop, value, asString,
                                                    lfbt);
}